

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O2

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::dispatch::detail::Dynamic_Object_Constructor::build_type_list
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,
          vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *tl)

{
  Type_Info *pTVar1;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  __last;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  __first;
  allocator_type local_9;
  
  pTVar1 = (tl->super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
           _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (tl->super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  __first._M_current = pTVar1 + 1;
  if (pTVar1 == __last._M_current) {
    __first._M_current = pTVar1;
  }
  std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>::
  vector<__gnu_cxx::__normal_iterator<chaiscript::Type_Info_const*,std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>>,void>
            ((vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>> *)
             __return_storage_ptr__,__first,__last,&local_9);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Type_Info> build_type_list(const std::vector<Type_Info> &tl) {
          auto begin = tl.begin();
          auto end = tl.end();

          if (begin != end) {
            ++begin;
          }

          return std::vector<Type_Info>(begin, end);
        }